

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_fold.c
# Opt level: O0

TRef fold_reassoc_bxor(jit_State *J)

{
  jit_State *J_local;
  uint local_4;
  
  if (((J->fold).left[0].field_1.t.irt & 0x40) == 0) {
    if ((J->fold).ins.field_0.op2 == (J->fold).left[0].field_0.op1) {
      local_4 = (uint)(J->fold).left[0].field_0.op2;
    }
    else if ((J->fold).ins.field_0.op2 == (J->fold).left[0].field_0.op2) {
      local_4 = (uint)(J->fold).left[0].field_0.op1;
    }
    else {
      local_4 = 0;
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

LJFOLD(BXOR BXOR any)
LJFOLDF(reassoc_bxor)
{
  PHIBARRIER(fleft);
  if (fins->op2 == fleft->op1)  /* (a xor b) xor a ==> b */
    return fleft->op2;
  if (fins->op2 == fleft->op2)  /* (a xor b) xor b ==> a */
    return fleft->op1;
  return NEXTFOLD;
}